

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O2

void test_read_append_filter_program(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  archive_entry *ae;
  
  wVar1 = canGzip();
  if (wVar1 != L'\0') {
    _a = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'¹',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    wVar1 = archive_read_set_format(_a,L'\x00030000');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                     ,L'º',(uint)(wVar1 == L'\0'),
                     "0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR)",_a);
    iVar2 = archive_read_append_filter_program(_a,"gzip -d");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'¼',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_append_filter_program(a, \"gzip -d\")",_a);
    iVar2 = archive_read_open_memory(_a,archive,0x5d);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'¾',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_open_memory(a, archive, sizeof(archive))",_a);
    iVar2 = archive_read_next_header(_a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'À',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",_a);
    iVar2 = archive_filter_code(_a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Á',(long)iVar2,"archive_filter_code(a, 0)",4,"ARCHIVE_FILTER_PROGRAM",
                        (void *)0x0);
    iVar2 = archive_format(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Â',(long)iVar2,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    iVar2 = archive_read_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Ã',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",_a);
    iVar2 = archive_read_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'Ä',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                 ,L'¶');
  test_skipping("Can\'t run gzip program on this platform");
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter_program)
{
  struct archive_entry *ae;
  struct archive *a;

  if (!canGzip()) {
    skipping("Can't run gzip program on this platform");
    return;
  }
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_append_filter_program(a, "gzip -d"));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_next_header(a, &ae));
  assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_PROGRAM);
  assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}